

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensus.hpp
# Opt level: O3

void __thiscall
opengv::sac::SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::
~SampleConsensus(SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                 *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer piVar1;
  
  this->_vptr_SampleConsensus = (_func_int **)&PTR__SampleConsensus_0026ea60;
  this_00 = (this->sac_model_).
            super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  piVar1 = (this->inliers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->model_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
    return;
  }
  return;
}

Assistant:

opengv::sac::SampleConsensus<P>::~SampleConsensus(){}